

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::SeekFromStart(ON_BinaryArchive *this,ON__UINT64 bytes_from_start)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *sFormat;
  
  bVar1 = ReadMode(this);
  if ((bVar1) || (bVar1 = WriteMode(this), bVar1)) {
    if ((this->m_bChunkBoundaryCheck != true) ||
       ((lVar3 = (long)(this->m_chunk).m_count, lVar3 < 1 ||
        ((this->m_chunk).m_a + lVar3 == (ON_3DM_BIG_CHUNK *)0x28)))) {
      if (this->m_current_positionX != 0) {
        iVar2 = (*this->_vptr_ON_BinaryArchive[4])(this);
        if ((char)iVar2 == '\0') {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x2ed,"","Internal_SeekToStartOverride() failed.");
          bVar1 = ReadMode(this);
          if (bVar1) {
            SetStorageDeviceError(this,0xfffffff9);
          }
          bVar1 = WriteMode(this);
          if (bVar1) {
            SetStorageDeviceError(this,0xfffffff2);
          }
          return false;
        }
        this->m_current_positionX = 0;
      }
      if (bytes_from_start == 0) {
        return true;
      }
      bVar1 = Internal_SeekCur(this,true,bytes_from_start);
      return bVar1;
    }
    sFormat = "Attempt to seek before beginning of current chunk.";
    iVar2 = 0x2e3;
  }
  else {
    sFormat = "Invalid archive Mode().";
    iVar2 = 0x2da;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,iVar2,"",sFormat);
  return false;
}

Assistant:

bool ON_BinaryArchive::SeekFromStart( ON__UINT64 bytes_from_start )
{
  if (UnsetMode())
  {
    ON_ERROR("Invalid archive Mode().");
    return false;
  }

  if (m_bChunkBoundaryCheck)
  {
    const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
    if (nullptr != c)
    {
      ON_ERROR("Attempt to seek before beginning of current chunk.");
      return false;
    }
  } 

  if (0 != CurrentPosition() )
  {
    // Internal_SeekToStart() is a pure virutal function that must overridden.
    if (!Internal_SeekToStartOverride())
    {
      ON_ERROR("Internal_SeekToStartOverride() failed.");
      if (ReadMode())
        SetStorageDeviceError(ON_BinaryArchive::eStorageDeviceError::SeekFailedDuringReading);
      if (WriteMode())
        SetStorageDeviceError(ON_BinaryArchive::eStorageDeviceError::SeekFailedDuringWriting);
      return false;
    }
    m_current_positionX = 0;
  }

  return (bytes_from_start > 0) ? SeekForward(bytes_from_start) : true;
}